

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall argo::json::move_json(json *this,json *other)

{
  json *other_local;
  json *this_local;
  
  if (this != other) {
    reset(this);
    this->m_type = other->m_type;
    if (this->m_type == object_e) {
      move_construct_object(this,&(other->m_value).u_object);
    }
    else if (this->m_type == array_e) {
      move_construct_array(this,&(other->m_value).u_array);
    }
    else if (this->m_type == string_e) {
      construct_string(this,&(other->m_value).u_string);
    }
    else if (this->m_type == boolean_e) {
      (this->m_value).u_boolean = (bool)((other->m_value).u_boolean & 1);
    }
    else if (this->m_type == number_int_e) {
      (this->m_value).u_number_int = (other->m_value).u_number_int;
    }
    else if (this->m_type == number_double_e) {
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (other->m_value).u_array.
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    std::__cxx11::string::operator=((string *)&this->m_raw_value,(string *)&other->m_raw_value);
    other->m_type = null_e;
  }
  return;
}

Assistant:

void json::move_json(json &other)
{
    if (this == &other) return;

    reset();
    m_type = other.m_type;
    if (m_type == object_e)
    {
        move_construct_object(std::move(other.m_value.u_object));
    }
    else if (m_type == array_e)
    {
        move_construct_array(std::move(other.m_value.u_array));
    }
    else if (m_type == string_e)
    {
        construct_string(other.m_value.u_string);
    }
    else if (m_type == boolean_e)
    {
        m_value.u_boolean = other.m_value.u_boolean;
    }
    else if (m_type == number_int_e)
    {
        m_value.u_number_int = other.m_value.u_number_int;
    }
    else if (m_type == number_double_e)
    {
        m_value.u_number_double = other.m_value.u_number_double;
    }

    m_raw_value = std::move(other.m_raw_value);

    other.m_type = null_e;
}